

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

bool icu_63::number::impl::GeneratorHelpers::notation
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  NotationType NVar1;
  UNumberCompactStyle UVar2;
  UErrorCode *extraout_RDX;
  bool bVar3;
  UChar local_6a [17];
  char16_t *local_48;
  char16_t *local_38;
  
  NVar1 = (macros->notation).fType;
  if (NVar1 == NTN_SCIENTIFIC) {
    if ((macros->notation).fUnion.scientific.fEngineeringInterval == '\x03') {
      UnicodeString::doAppend(sb,L"engineering",0,-1);
      local_48 = L"engineering";
    }
    else {
      UnicodeString::doAppend(sb,L"scientific",0,-1);
      local_38 = L"scientific";
    }
    if (1 < (macros->notation).fUnion.scientific.fMinExponentDigits) {
      local_6a[0] = L'/';
      UnicodeString::doAppend(sb,local_6a,0,1);
      blueprint_helpers::generateExponentWidthOption
                ((int)(macros->notation).fUnion.scientific.fMinExponentDigits,sb,extraout_RDX);
      if (U_ZERO_ERROR < *status) {
        return false;
      }
    }
    if ((macros->notation).fUnion.scientific.fExponentSignDisplay == UNUM_SIGN_AUTO) {
      return true;
    }
    local_6a[0] = L'/';
    UnicodeString::doAppend(sb,local_6a,0,1);
    enum_to_stem_string::signDisplay((macros->notation).fUnion.scientific.fExponentSignDisplay,sb);
    return true;
  }
  if (NVar1 == NTN_COMPACT) {
    UVar2 = (macros->notation).fUnion.compactStyle;
    if (UVar2 == UNUM_SHORT) {
      UnicodeString::doAppend(sb,L"compact-short",0,-1);
    }
    else {
      if (UVar2 != UNUM_LONG) {
        *status = U_UNSUPPORTED_ERROR;
        goto LAB_0027790d;
      }
      UnicodeString::doAppend(sb,L"compact-long",0,-1);
    }
    bVar3 = true;
  }
  else {
LAB_0027790d:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool GeneratorHelpers::notation(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.notation.fType == Notation::NTN_COMPACT) {
        UNumberCompactStyle style = macros.notation.fUnion.compactStyle;
        if (style == UNumberCompactStyle::UNUM_LONG) {
            sb.append(u"compact-long", -1);
            return true;
        } else if (style == UNumberCompactStyle::UNUM_SHORT) {
            sb.append(u"compact-short", -1);
            return true;
        } else {
            // Compact notation generated from custom data (not supported in skeleton)
            // The other compact notations are literals
            status = U_UNSUPPORTED_ERROR;
            return false;
        }
    } else if (macros.notation.fType == Notation::NTN_SCIENTIFIC) {
        const Notation::ScientificSettings& impl = macros.notation.fUnion.scientific;
        if (impl.fEngineeringInterval == 3) {
            sb.append(u"engineering", -1);
        } else {
            sb.append(u"scientific", -1);
        }
        if (impl.fMinExponentDigits > 1) {
            sb.append(u'/');
            blueprint_helpers::generateExponentWidthOption(impl.fMinExponentDigits, sb, status);
            if (U_FAILURE(status)) {
                return false;
            }
        }
        if (impl.fExponentSignDisplay != UNUM_SIGN_AUTO) {
            sb.append(u'/');
            enum_to_stem_string::signDisplay(impl.fExponentSignDisplay, sb);
        }
        return true;
    } else {
        // Default value is not shown in normalized form
        return false;
    }
}